

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.c
# Opt level: O3

_Bool options_save_custom(player_options *opts,int page)

{
  _Bool _Var1;
  _Bool _Var2;
  _Bool _Var3;
  ang_file *f;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  int *piVar7;
  bool bVar8;
  char file_name [80];
  char path [1024];
  char local_488 [80];
  char local_438 [1032];
  
  if ((uint)page < 5) {
    pcVar6 = *(char **)(&DAT_002831e0 + (ulong)(uint)page * 8);
  }
  else {
    pcVar6 = "unknown";
  }
  _Var1 = false;
  strnfmt(local_488,0x50,"customized_%s_options.txt",pcVar6);
  path_build(local_438,0x400,ANGBAND_DIR_USER,local_488);
  f = file_open(local_438,MODE_WRITE,FTYPE_TEXT);
  if (f != (ang_file *)0x0) {
    _Var1 = file_putf(f,"# These are customized defaults for the %s options.\n",pcVar6);
    _Var2 = file_put(f,"# All lines begin with \"option:\" followed by the internal option name.\n")
    ;
    _Var3 = file_put(f,
                     "# After the name is a colon followed by yes or no for the option\'s state.\n")
    ;
    bVar8 = (_Var3 && _Var2) && _Var1;
    piVar7 = &options[0].type;
    lVar5 = 0;
    do {
      if (*piVar7 == page) {
        pcVar6 = ((option_entry *)(piVar7 + -4))->name;
        _Var1 = file_putf(f,"# %s\n",*(char **)(piVar7 + -2));
        pcVar4 = "no";
        if (opts->opt[lVar5] != false) {
          pcVar4 = "yes";
        }
        _Var2 = file_putf(f,"option:%s:%s\n",pcVar6,pcVar4);
        bVar8 = (bool)(_Var1 & bVar8 & _Var2);
      }
      lVar5 = lVar5 + 1;
      piVar7 = piVar7 + 6;
    } while (lVar5 != 0x2c);
    _Var1 = file_close(f);
    _Var1 = (_Bool)(_Var1 & bVar8);
  }
  return _Var1;
}

Assistant:

bool options_save_custom(struct player_options *opts, int page)
{
	const char *page_name = option_type_name(page);
	bool success = true;
	char path[1024], file_name[80];
	ang_file *f;

	strnfmt(file_name, sizeof(file_name), "customized_%s_options.txt",
		page_name);
	path_build(path, sizeof(path), ANGBAND_DIR_USER, file_name);
	f = file_open(path, MODE_WRITE, FTYPE_TEXT);
	if (f) {
		int opt;

		if (!file_putf(f, "# These are customized defaults for the %s options.\n", page_name)) {
			success = false;
		}
		if (!file_put(f, "# All lines begin with \"option:\" followed by the internal option name.\n")) {
			success = false;
		}
		if (!file_put(f, "# After the name is a colon followed by yes or no for the option's state.\n")) {
			success = false;
		}
		for (opt = 0; opt < OPT_MAX; opt++) {
			if (options[opt].type == page) {
				if (!file_putf(f, "# %s\n",
						 options[opt].description)) {
					success = false;
				}
				if (!file_putf(f, "option:%s:%s\n",
						options[opt].name,
						((*opts).opt[opt]) ? "yes" : "no")) {
					success = false;
				}
			}
		}

		if (!file_close(f)) {
			success = false;
		}
	} else {
		success = false;
	}
	return success;
}